

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

_Bool plutovg_path_parse(plutovg_path_t *path,char *data,int length)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  char *end_00;
  bool bVar4;
  char local_75;
  float local_74;
  char last_command;
  float fStack_70;
  char command;
  float last_control_y;
  float last_control_x;
  float current_y;
  float current_x;
  float start_y;
  float start_x;
  float fStack_54;
  _Bool flags [2];
  float values [6];
  char *end;
  char *it;
  char *pcStack_20;
  int length_local;
  char *data_local;
  plutovg_path_t *path_local;
  
  it._4_4_ = length;
  pcStack_20 = data;
  data_local = (char *)path;
  if (length == -1) {
    sVar3 = strlen(data);
    it._4_4_ = (int)sVar3;
  }
  end = pcStack_20;
  end_00 = pcStack_20 + it._4_4_;
  current_x = 0.0;
  current_y = 0.0;
  last_control_x = 0.0;
  last_control_y = 0.0;
  fStack_70 = 0.0;
  local_74 = 0.0;
  local_75 = '\0';
  plutovg_skip_ws(&end,end_00);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      cVar1 = local_75;
                      if (end_00 <= end) {
                        return true;
                      }
                      if ((('`' < *end) && (*end < '{')) || (('@' < *end && (*end < '[')))) {
                        local_75 = *end;
                        end = end + 1;
                        plutovg_skip_ws(&end,end_00);
                      }
                      if (((cVar1 == '\0') && (local_75 != 'M')) && (local_75 != 'm')) {
                        return false;
                      }
                      if ((local_75 != 'M') && (local_75 != 'm')) break;
                      _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,2);
                      if (!_Var2) {
                        return false;
                      }
                      if (local_75 == 'm') {
                        start_x = last_control_x + start_x;
                        fStack_54 = last_control_y + fStack_54;
                      }
                      plutovg_path_move_to((plutovg_path_t *)data_local,start_x,fStack_54);
                      current_x = start_x;
                      last_control_x = start_x;
                      current_y = fStack_54;
                      last_control_y = fStack_54;
                      bVar4 = local_75 == 'm';
                      local_75 = 'L';
                      if (bVar4) {
                        local_75 = 'l';
                      }
                    }
                    if ((local_75 != 'L') && (local_75 != 'l')) break;
                    _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,2);
                    if (!_Var2) {
                      return false;
                    }
                    if (local_75 == 'l') {
                      start_x = last_control_x + start_x;
                      fStack_54 = last_control_y + fStack_54;
                    }
                    plutovg_path_line_to((plutovg_path_t *)data_local,start_x,fStack_54);
                    last_control_x = start_x;
                    last_control_y = fStack_54;
                  }
                  if ((local_75 != 'H') && (local_75 != 'h')) break;
                  _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,1);
                  if (!_Var2) {
                    return false;
                  }
                  if (local_75 == 'h') {
                    start_x = last_control_x + start_x;
                  }
                  plutovg_path_line_to((plutovg_path_t *)data_local,start_x,last_control_y);
                  last_control_x = start_x;
                }
                if ((local_75 != 'V') && (local_75 != 'v')) break;
                _Var2 = parse_path_coordinates(&end,end_00,&start_x,1,1);
                if (!_Var2) {
                  return false;
                }
                if (local_75 == 'v') {
                  fStack_54 = last_control_y + fStack_54;
                }
                plutovg_path_line_to((plutovg_path_t *)data_local,last_control_x,fStack_54);
                last_control_y = fStack_54;
              }
              if ((local_75 != 'Q') && (local_75 != 'q')) break;
              _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,4);
              if (!_Var2) {
                return false;
              }
              if (local_75 == 'q') {
                start_x = last_control_x + start_x;
                fStack_54 = last_control_y + fStack_54;
                values[0] = last_control_x + values[0];
                values[1] = last_control_y + values[1];
              }
              plutovg_path_quad_to
                        ((plutovg_path_t *)data_local,start_x,fStack_54,values[0],values[1]);
              fStack_70 = start_x;
              local_74 = fStack_54;
              last_control_x = values[0];
              last_control_y = values[1];
            }
            if ((local_75 != 'C') && (local_75 != 'c')) break;
            _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,6);
            if (!_Var2) {
              return false;
            }
            if (local_75 == 'c') {
              start_x = last_control_x + start_x;
              fStack_54 = last_control_y + fStack_54;
              values[0] = last_control_x + values[0];
              values[1] = last_control_y + values[1];
              values[2] = last_control_x + values[2];
              values[3] = last_control_y + values[3];
            }
            plutovg_path_cubic_to
                      ((plutovg_path_t *)data_local,start_x,fStack_54,values[0],values[1],values[2],
                       values[3]);
            fStack_70 = values[0];
            local_74 = values[1];
            last_control_x = values[2];
            last_control_y = values[3];
          }
          if ((local_75 != 'T') && (local_75 != 't')) break;
          if ((cVar1 == 'Q') || (((cVar1 == 'q' || (cVar1 == 'T')) || (cVar1 == 't')))) {
            start_x = last_control_x + last_control_x + -fStack_70;
            fStack_54 = last_control_y + last_control_y + -local_74;
          }
          else {
            start_x = last_control_x;
            fStack_54 = last_control_y;
          }
          _Var2 = parse_path_coordinates(&end,end_00,&start_x,2,2);
          if (!_Var2) {
            return false;
          }
          if (local_75 == 't') {
            values[0] = last_control_x + values[0];
            values[1] = last_control_y + values[1];
          }
          plutovg_path_quad_to((plutovg_path_t *)data_local,start_x,fStack_54,values[0],values[1]);
          fStack_70 = start_x;
          local_74 = fStack_54;
          last_control_x = values[0];
          last_control_y = values[1];
        }
        if ((local_75 != 'S') && (local_75 != 's')) break;
        if (((cVar1 == 'C') || ((cVar1 == 'c' || (cVar1 == 'S')))) || (cVar1 == 's')) {
          start_x = last_control_x + last_control_x + -fStack_70;
          fStack_54 = last_control_y + last_control_y + -local_74;
        }
        else {
          start_x = last_control_x;
          fStack_54 = last_control_y;
        }
        _Var2 = parse_path_coordinates(&end,end_00,&start_x,2,4);
        if (!_Var2) {
          return false;
        }
        if (local_75 == 's') {
          values[0] = last_control_x + values[0];
          values[1] = last_control_y + values[1];
          values[2] = last_control_x + values[2];
          values[3] = last_control_y + values[3];
        }
        plutovg_path_cubic_to
                  ((plutovg_path_t *)data_local,start_x,fStack_54,values[0],values[1],values[2],
                   values[3]);
        fStack_70 = values[0];
        local_74 = values[1];
        last_control_x = values[2];
        last_control_y = values[3];
      }
      if ((local_75 != 'A') && (local_75 != 'a')) break;
      _Var2 = parse_path_coordinates(&end,end_00,&start_x,0,3);
      if ((!_Var2) ||
         (((_Var2 = parse_arc_flag(&end,end_00,(_Bool *)((long)&start_y + 2)), !_Var2 ||
           (_Var2 = parse_arc_flag(&end,end_00,(_Bool *)((long)&start_y + 3)), !_Var2)) ||
          (_Var2 = parse_path_coordinates(&end,end_00,&start_x,3,2), !_Var2)))) {
        return false;
      }
      if (local_75 == 'a') {
        values[1] = last_control_x + values[1];
        values[2] = last_control_y + values[2];
      }
      plutovg_path_arc_to((plutovg_path_t *)data_local,start_x,fStack_54,values[0] * 0.017453292,
                          (_Bool)(start_y._2_1_ & 1),(_Bool)(start_y._3_1_ & 1),values[1],values[2])
      ;
      last_control_x = values[1];
      last_control_y = values[2];
    }
    if ((local_75 != 'Z') && (local_75 != 'z')) {
      return false;
    }
    if ((cVar1 == 'Z') || (cVar1 == 'z')) break;
    plutovg_path_close((plutovg_path_t *)data_local);
    last_control_x = current_x;
    last_control_y = current_y;
  }
  return false;
}

Assistant:

bool plutovg_path_parse(plutovg_path_t* path, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;

    float values[6];
    bool flags[2];

    float start_x = 0;
    float start_y = 0;
    float current_x = 0;
    float current_y = 0;
    float last_control_x = 0;
    float last_control_y = 0;

    char command = 0;
    char last_command = 0;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(PLUTOVG_IS_ALPHA(*it)) {
            command = *it++;
            plutovg_skip_ws(&it, end);
        }

        if(!last_command && !(command == 'M' || command == 'm'))
            return false;
        if(command == 'M' || command == 'm') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'm') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_move_to(path, values[0], values[1]);
            current_x = start_x = values[0];
            current_y = start_y = values[1];
            command = command == 'm' ? 'l' : 'L';
        } else if(command == 'L' || command == 'l') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'l') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_line_to(path, values[0], values[1]);
            current_x = values[0];
            current_y = values[1];
        } else if(command == 'H' || command == 'h') {
            if(!parse_path_coordinates(&it, end, values, 0, 1))
                return false;
            if(command == 'h') {
                values[0] += current_x;
            }

            plutovg_path_line_to(path, values[0], current_y);
            current_x = values[0];
        } else if(command == 'V' || command == 'v') {
            if(!parse_path_coordinates(&it, end, values, 1, 1))
                return false;
            if(command == 'v') {
                values[1] += current_y;
            }

            plutovg_path_line_to(path, current_x, values[1]);
            current_y = values[1];
        } else if(command == 'Q' || command == 'q') {
            if(!parse_path_coordinates(&it, end, values, 0, 4))
                return false;
            if(command == 'q') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'C' || command == 'c') {
            if(!parse_path_coordinates(&it, end, values, 0, 6))
                return false;
            if(command == 'c') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'T' || command == 't') {
            if(last_command != 'Q' && last_command != 'q' && last_command != 'T' && last_command != 't') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 2))
                return false;
            if(command == 't') {
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'S' || command == 's') {
            if(last_command != 'C' && last_command != 'c' && last_command != 'S' && last_command != 's') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 4))
                return false;
            if(command == 's') {
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'A' || command == 'a') {
            if(!parse_path_coordinates(&it, end, values, 0, 3)
                || !parse_arc_flag(&it, end, &flags[0])
                || !parse_arc_flag(&it, end, &flags[1])
                || !parse_path_coordinates(&it, end, values, 3, 2)) {
                return false;
            }

            if(command == 'a') {
                values[3] += current_x;
                values[4] += current_y;
            }

            plutovg_path_arc_to(path, values[0], values[1], PLUTOVG_DEG2RAD(values[2]), flags[0], flags[1], values[3], values[4]);
            current_x = values[3];
            current_y = values[4];
        } else if(command == 'Z' || command == 'z') {
            if(last_command == 'Z' || last_command == 'z')
                return false;
            plutovg_path_close(path);
            current_x = start_x;
            current_y = start_y;
        } else {
            return false;
        }

        last_command = command;
    }

    return true;
}